

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

int __thiscall
CNet::GetWires3D(CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWires,CPoint *pPoint,
                int iMode,int iValue)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  iterator iVar3;
  CNet *pCVar4;
  uint uVar5;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> _Var6;
  pointer ppCVar7;
  CWire *pWire;
  deque<CPoint_*,_std::allocator<CPoint_*>_> Queue;
  CWire *local_98;
  CPoint *local_90;
  _Deque_base<CPoint_*,_std::allocator<CPoint_*>_> local_88;
  CNet *local_38;
  
  if (pPoint == (CPoint *)0x0) {
    ppCVar7 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar7 != ppCVar2) {
      local_90 = (CPoint *)0x0;
      do {
        local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*ppCVar7;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_equals_val<CWire*const>>
                          ((pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                           (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish,&local_88);
        iVar3._M_current =
             (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (_Var6._M_current != iVar3._M_current) {
          __assert_fail("find(pWires->begin(),pWires->end(),pWire)==pWires->end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,900,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
        }
        if (iMode == 1) {
          uVar5 = ((CObject *)local_88._M_impl.super__Deque_impl_data._M_map)->m_iState;
        }
        else {
          if (iMode != 0) {
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                          ,0x38f,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
          }
          uVar5 = ((CObject *)local_88._M_impl.super__Deque_impl_data._M_map)->m_iProp;
        }
        if ((uVar5 & iValue) != 0) {
          if (iVar3._M_current ==
              (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                      ((vector<CWire*,std::allocator<CWire*>> *)pWires,iVar3,(CWire **)&local_88);
          }
          else {
            *iVar3._M_current = (CWire *)local_88._M_impl.super__Deque_impl_data._M_map;
            pppCVar1 = &(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
        }
        ppCVar7 = ppCVar7 + 1;
      } while (ppCVar7 != ppCVar2);
    }
  }
  else {
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_90 = pPoint;
    std::_Deque_base<CPoint_*,_std::allocator<CPoint_*>_>::_M_initialize_map(&local_88,0);
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_first) {
      std::deque<CPoint*,std::allocator<CPoint*>>::_M_push_front_aux<CPoint*const&>
                ((deque<CPoint*,std::allocator<CPoint*>> *)&local_88,&local_90);
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = local_90;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
    }
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_38 = this;
      do {
        pCVar4 = local_38;
        local_90 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_88._M_impl.super__Deque_impl_data._M_start._M_last =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_88._M_impl.super__Deque_impl_data._M_start._M_first =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_88._M_impl.super__Deque_impl_data._M_start._M_node =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        ppCVar2 = (pCVar4->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppCVar7 = (pCVar4->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar2;
            ppCVar7 = ppCVar7 + 1) {
          local_98 = *ppCVar7;
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_equals_val<CWire*const>>
                            ((pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                             .super__Vector_impl_data._M_start,
                             (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                             .super__Vector_impl_data._M_finish,&local_98);
          if (_Var6._M_current ==
              (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            if (iMode == 1) {
              if (((local_98->super_CObject).m_iState & iValue) != 0) goto LAB_0011a74e;
LAB_0011a73b:
              uVar5 = 0;
            }
            else {
              if (iMode != 0) {
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                              ,0x3ac,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
              }
              if (((local_98->super_CObject).m_iProp & iValue) == 0) goto LAB_0011a73b;
LAB_0011a74e:
              uVar5 = CWire::IsOn3D(local_98,local_90);
            }
            if ((uVar5 & 3) != 0) {
              iVar3._M_current =
                   (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                          ((vector<CWire*,std::allocator<CWire*>> *)pWires,iVar3,&local_98);
              }
              else {
                *iVar3._M_current = local_98;
                pppCVar1 = &(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppCVar1 = *pppCVar1 + 1;
              }
            }
            if ((uVar5 & 2) != 0) {
              if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_start._M_first) {
                std::deque<CPoint*,std::allocator<CPoint*>>::_M_push_front_aux<CPoint*const&>
                          ((deque<CPoint*,std::allocator<CPoint*>> *)&local_88,&local_98->m_pPointS)
                ;
              }
              else {
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = local_98->m_pPointS;
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
              }
            }
            if ((uVar5 & 1) != 0) {
              if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_start._M_first) {
                std::deque<CPoint*,std::allocator<CPoint*>>::_M_push_front_aux<CPoint*const&>
                          ((deque<CPoint*,std::allocator<CPoint*>> *)&local_88,&local_98->m_pPointE)
                ;
              }
              else {
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = local_98->m_pPointE;
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
              }
            }
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::_Deque_base<CPoint_*,_std::allocator<CPoint_*>_>::~_Deque_base(&local_88);
  }
  return (int)((ulong)((long)(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int CNet::GetWires3D(vector<CWire*>* pWires, CPoint* pPoint, int iMode, int iValue)
{
	if(!pPoint)
	{
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			assert(find(pWires->begin(),pWires->end(),pWire)==pWires->end());

			int	iRet	=	RET_WIRE_NONE;
			switch(iMode) {
			case GET_MODE_PROP:
				if(pWire->GetProp()&iValue)		pWires->push_back(pWire);
				break;
			case GET_MODE_STATE:
				if(pWire->GetState()&iValue)	pWires->push_back(pWire);
				break;
			default:
				assert(FALSE);
				break;
			}
		}
	}
	else
	{
		deque<CPoint*> Queue;
		
		Queue.push_front(pPoint);
		
		while(!Queue.empty())
		{
			pPoint	=	Queue.front();Queue.pop_front();
			for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				if(find(pWires->begin(),pWires->end(),pWire)!=pWires->end())	continue;
				
				int	iRet	=	RET_WIRE_NONE;
				switch(iMode) {
				case GET_MODE_PROP:
					if(pWire->GetProp()&iValue)		iRet	=	pWire->IsOn3D(pPoint);
					break;
				case GET_MODE_STATE:
					if(pWire->GetState()&iValue)	iRet	=	pWire->IsOn3D(pPoint);
					break;
				default:
					assert(FALSE);
					break;
				}
				
				if(iRet&RET_WIRE_SE)	pWires->push_back(pWire);
				if(iRet&RET_WIRE_E)		Queue.push_front(pWire->m_pPointS);				
				if(iRet&RET_WIRE_S)		Queue.push_front(pWire->m_pPointE);
			}
		}
	}
	return	pWires->size();
}